

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testrunner.cpp
# Opt level: O3

void __thiscall trun::TestRunner::PrepareTests(TestRunner *this)

{
  size_type *psVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  Log *this_00;
  char *arguments_1;
  long *plVar3;
  pointer pcVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  element_type *this_01;
  undefined8 uVar6;
  bool bVar7;
  int iVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_02;
  long *plVar9;
  Ref func;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> x;
  string moduleName;
  undefined1 local_c8 [24];
  element_type *peStack_b0;
  string local_a8;
  element_type *local_88;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  undefined1 local_58 [32];
  __shared_count<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  this_00 = this->pLogger;
  iVar8 = (*((this->library).super___shared_ptr<trun::IDynLibrary,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr)->_vptr_IDynLibrary[6])();
  arguments_1 = *(char **)CONCAT44(extraout_var,iVar8);
  Version::AsString_abi_cxx11_
            (&local_a8,
             &((this->library).super___shared_ptr<trun::IDynLibrary,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->version);
  gnilk::Log::Info<char_const*,char_const*,char_const*>
            (this_00,"Prepare tests in library: %s (%s)",arguments_1,local_a8._M_dataplus._M_p);
  paVar2 = &local_a8.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != paVar2) {
    operator_delete(local_a8._M_dataplus._M_p,(ulong)(local_a8.field_2._M_allocated_capacity + 1));
  }
  iVar8 = (*((this->library).super___shared_ptr<trun::IDynLibrary,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr)->_vptr_IDynLibrary[5])();
  plVar9 = *(long **)CONCAT44(extraout_var_00,iVar8);
  plVar3 = (long *)((long *)CONCAT44(extraout_var_00,iVar8))[1];
  if (plVar9 != plVar3) {
    local_58._24_8_ =
         &(this->globalExit).super___shared_ptr<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount;
    local_38 = &(this->globalMain).super___shared_ptr<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount;
    do {
      local_a8._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char*>((string *)&local_a8,*plVar9,plVar9[1] + *plVar9);
      CreateTestFunc((TestRunner *)local_c8,&local_a8);
      if ((element_type *)local_c8._0_8_ != (element_type *)0x0) {
        local_88 = (this->library).super___shared_ptr<trun::IDynLibrary,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr;
        local_80._M_pi =
             (this->library).super___shared_ptr<trun::IDynLibrary,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
        if ((element_type *)local_80._M_pi != (element_type *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            psVar1 = &(((element_type *)local_80._M_pi)->symbolName)._M_string_length;
            *(int *)psVar1 = (int)*psVar1 + 1;
            UNLOCK();
          }
          else {
            psVar1 = &(((element_type *)local_80._M_pi)->symbolName)._M_string_length;
            *(int *)psVar1 = (int)*psVar1 + 1;
          }
        }
        (((Ref *)(local_c8._0_8_ + 0x78))->
        super___shared_ptr<trun::IDynLibrary,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = local_88;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                  (&(((Ref *)(local_c8._0_8_ + 0x78))->
                    super___shared_ptr<trun::IDynLibrary,_(__gnu_cxx::_Lock_policy)2>)._M_refcount,
                   &local_80);
        if ((element_type *)local_80._M_pi != (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_80._M_pi);
        }
        local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
        pcVar4 = (((string *)(local_c8._0_8_ + 0x20))->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_78,pcVar4,
                   pcVar4 + ((string *)(local_c8._0_8_ + 0x20))->_M_string_length);
        gnilk::Log::Info<char_const*,char_const*,char_const*,char_const*>
                  (this->pLogger,"  Module: %s, case: %s, Symbol: %s",
                   (((string *)(local_c8._0_8_ + 0x20))->_M_dataplus)._M_p,
                   (((string *)(local_c8._0_8_ + 0x40))->_M_dataplus)._M_p,local_a8._M_dataplus._M_p
                  );
        iVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                compare(&local_78,"-");
        if (iVar8 == 0) {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                    (&local_78,(string *)(local_c8._0_8_ + 0x40));
        }
        bVar7 = TestFunc::IsGlobalMain((TestFunc *)local_c8._0_8_);
        if (bVar7) {
          *(kTestScope *)(local_c8._0_8_ + 0x68) = kGlobal;
          (this->globalMain).super___shared_ptr<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)local_c8._0_8_;
          this_02 = local_38;
LAB_00129351:
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                    (this_02,(__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_c8 + 8));
        }
        else {
          bVar7 = TestFunc::IsGlobalExit((TestFunc *)local_c8._0_8_);
          if (bVar7) {
            *(kTestScope *)(local_c8._0_8_ + 0x68) = kGlobal;
            (this->globalExit).super___shared_ptr<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                 = (element_type *)local_c8._0_8_;
            this_02 = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_58._24_8_;
            goto LAB_00129351;
          }
          GetOrAddModule((TestRunner *)(local_c8 + 0x10),(string *)this);
          bVar7 = TestFunc::IsGlobal((TestFunc *)local_c8._0_8_);
          if (bVar7) {
            *(kTestScope *)(local_c8._0_8_ + 0x68) = kModuleMain;
            ((__shared_ptr<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2> *)
            &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_c8._16_8_ + 0x80))->
             _vptr__Sp_counted_base)->_M_ptr = (element_type *)local_c8._0_8_;
            p_Var5 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_c8._16_8_ + 0x80);
LAB_00129416:
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&p_Var5->_M_use_count,
                       (__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_c8 + 8));
          }
          else {
            bVar7 = TestFunc::IsModuleExit((TestFunc *)local_c8._0_8_);
            if (bVar7) {
              *(kTestScope *)(local_c8._0_8_ + 0x68) = kModuleExit;
              ((__shared_ptr<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2> *)
              &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_c8._16_8_ + 0x90))->
               _vptr__Sp_counted_base)->_M_ptr = (element_type *)local_c8._0_8_;
              p_Var5 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_c8._16_8_ + 0x90);
              goto LAB_00129416;
            }
            GetOrAddModule((TestRunner *)local_58,(string *)this);
            uVar6 = local_58._8_8_;
            local_c8._16_8_ = local_58._0_8_;
            this_01 = peStack_b0;
            local_58._0_8_ = (TestModule *)0x0;
            local_58._8_8_ = (element_type *)0x0;
            peStack_b0 = (element_type *)uVar6;
            if ((this_01 != (element_type *)0x0) &&
               (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_01),
               (element_type *)local_58._8_8_ != (element_type *)0x0)) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_);
            }
            *(kTestScope *)(local_c8._0_8_ + 0x68) = kModuleCase;
            TestModule::AddTestFunc((TestModule *)local_c8._16_8_,(Ref *)local_c8);
          }
          if (peStack_b0 != (element_type *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peStack_b0);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != &local_78.field_2) {
          operator_delete(local_78._M_dataplus._M_p,
                          (ulong)(local_78.field_2._M_allocated_capacity + 1));
        }
      }
      if ((element_type *)local_c8._8_8_ != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._8_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != paVar2) {
        operator_delete(local_a8._M_dataplus._M_p,
                        (ulong)(local_a8.field_2._M_allocated_capacity + 1));
      }
      plVar9 = plVar9 + 4;
    } while (plVar9 != plVar3);
  }
  return;
}

Assistant:

void TestRunner::PrepareTests() {

    pLogger->Info("Prepare tests in library: %s (%s)", library->Name().c_str(), library->GetVersion().AsString().c_str());
    for(auto x:library->Exports()) {

        TestFunc::Ref func = CreateTestFunc(x);
        if (func == nullptr) {
            continue;
        }

        func->SetLibrary(library);

        std::string moduleName = func->ModuleName();
        pLogger->Info("  Module: %s, case: %s, Symbol: %s", func->ModuleName().c_str(), func->CaseName().c_str(), x.c_str());

        // Ok, this is the signature of the main function for a 'library' (group of functions)
        if (moduleName == "-") {
            moduleName = func->CaseName();
        }

        // Identify the symbol/pattern and assign it properly
        // The 'TestScope' is a simplification for later
        if (func->IsGlobalMain()) {
            func->SetTestScope(TestFunc::kTestScope::kGlobal);
            globalMain = func;
        } else if (func->IsGlobalExit()) {
            func->SetTestScope(TestFunc::kTestScope::kGlobal);
            globalExit = func;
        } else {
            // These are module functions - and handled differently and with lower priority
            // Note: the 'GetOrAdd' module will create a module if not found...
            auto tModule = GetOrAddModule(moduleName);
            if (func->IsGlobal()) {
                func->SetTestScope(TestFunc::kTestScope::kModuleMain);
                tModule->mainFunc = func;
            } else if (func->IsModuleExit()) {
                func->SetTestScope(TestFunc::kTestScope::kModuleExit);
                tModule->exitFunc = func;
            } else {
                tModule = GetOrAddModule(moduleName);
                func->SetTestScope(TestFunc::kTestScope::kModuleCase);
                tModule->AddTestFunc(func);
            }
        }
    }
    // Note: We can't resolve dependencies here as they are configured during module main
}